

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

ValueHolder * __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::DefaultValueHolderFactory::MakeNewHolder(DefaultValueHolderFactory *this)

{
  long lVar1;
  ValueHolder *pVVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar2 = (ValueHolder *)operator_new(0x20);
  (pVVar2->super_ThreadLocalValueHolderBase)._vptr_ThreadLocalValueHolderBase =
       (_func_int **)&PTR__ValueHolder_0018ad78;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (pVVar2->value_).
    super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pVVar2->value_).
    super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pVVar2->value_).
    super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return pVVar2;
  }
  __stack_chk_fail();
}

Assistant:

virtual ValueHolder* MakeNewHolder() const { return new ValueHolder(); }